

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O1

bool __thiscall
re2::Regexp::RequiredPrefix(Regexp *this,string *prefix,bool *foldcase,Regexp **suffix)

{
  ushort uVar1;
  uint16_t uVar2;
  Regexp *pRVar3;
  long lVar4;
  bool bVar5;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar6;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar7;
  ulong uVar8;
  Regexp *pRVar9;
  uint uVar10;
  int nrunes;
  anon_union_16_7_2f55f9ff_for_Regexp_10 *runes;
  uint uVar11;
  ulong uVar12;
  bool bVar13;
  
  uVar12 = 0;
  prefix->_M_string_length = 0;
  *(prefix->_M_dataplus)._M_p = '\0';
  *foldcase = false;
  *suffix = (Regexp *)0x0;
  bVar5 = false;
  if (this->op_ == '\x05') {
    uVar1 = this->nsub_;
    bVar13 = uVar1 != 0;
    uVar10 = (uint)uVar1;
    if (bVar13) {
      if (uVar10 == 1) {
        paVar6 = &this->field_5;
      }
      else {
        paVar6 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(this->field_5).submany_;
      }
      if (paVar6->subone_->op_ == '\x12') {
        uVar12 = 0;
        do {
          if ((ulong)uVar10 - 1 == uVar12) {
            bVar13 = uVar12 + 1 < (ulong)uVar1;
            uVar12 = (ulong)uVar10;
            goto LAB_00225471;
          }
          lVar4 = uVar12 + 1;
          uVar12 = uVar12 + 1;
        } while ((paVar6[lVar4].subone_)->op_ == '\x12');
        bVar13 = uVar12 < uVar1;
      }
    }
LAB_00225471:
    bVar5 = false;
    if (((int)uVar12 != 0) && (bVar5 = false, bVar13)) {
      paVar6 = &this->field_5;
      paVar7 = paVar6;
      if (1 < uVar1) {
        paVar7 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(this->field_5).submany_;
      }
      pRVar3 = paVar7[uVar12 & 0xffffffff].subone_;
      if ((byte)(pRVar3->op_ - 3) < 2) {
        uVar11 = (int)uVar12 + 1;
        if (uVar11 < uVar10) {
          uVar1 = this->nsub_;
          uVar8 = (ulong)uVar1;
          if (uVar11 < uVar1) {
            uVar12 = (uVar12 & 0xffffffff) + 1;
            do {
              paVar7 = paVar6;
              if (1 < (ushort)uVar8) {
                paVar7 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(this->field_5).submany_;
              }
              Incref(paVar7[uVar12].subone_);
              uVar12 = uVar12 + 1;
              uVar1 = this->nsub_;
              uVar8 = (ulong)uVar1;
            } while (uVar12 < uVar8);
          }
          if (1 < uVar1) {
            paVar6 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(this->field_5).submany_;
          }
          pRVar9 = ConcatOrAlternate(kRegexpConcat,&paVar6[uVar11].subone_,uVar1 - uVar11,
                                     (uint)this->parse_flags_,false);
        }
        else {
          pRVar9 = (Regexp *)operator_new(0x28);
          uVar2 = this->parse_flags_;
          pRVar9->op_ = '\x02';
          pRVar9->simple_ = '\0';
          pRVar9->parse_flags_ = uVar2;
          pRVar9->ref_ = 1;
          *(undefined8 *)((long)&pRVar9->down_ + 6) = 0;
          *(undefined8 *)((long)&(pRVar9->field_7).field_3.cc_ + 6) = 0;
          *(undefined8 *)&pRVar9->nsub_ = 0;
          *(undefined8 *)((long)&pRVar9->field_5 + 6) = 0;
          *(undefined2 *)((long)&pRVar9->field_7 + 0xe) = 0;
        }
        *suffix = pRVar9;
        if (pRVar3->op_ == '\x03') {
          runes = &pRVar3->field_7;
        }
        else {
          runes = (anon_union_16_7_2f55f9ff_for_Regexp_10 *)(pRVar3->field_7).field_2.runes_;
        }
        nrunes = 1;
        if (pRVar3->op_ != '\x03') {
          nrunes = (pRVar3->field_7).field_0.max_;
        }
        ConvertRunesToBytes(SUB41((pRVar3->parse_flags_ & 0x20) >> 5,0),&runes->rune_,nrunes,prefix)
        ;
        *foldcase = (bool)((byte)pRVar3->parse_flags_ & 1);
        bVar5 = true;
      }
      else {
        bVar5 = false;
      }
    }
  }
  return bVar5;
}

Assistant:

bool Regexp::RequiredPrefix(std::string* prefix, bool* foldcase,
                            Regexp** suffix) {
  prefix->clear();
  *foldcase = false;
  *suffix = NULL;

  // No need for a walker: the regexp must be of the form
  // 1. some number of ^ anchors
  // 2. a literal char or string
  // 3. the rest
  if (op_ != kRegexpConcat)
    return false;
  int i = 0;
  while (i < nsub_ && sub()[i]->op_ == kRegexpBeginText)
    i++;
  if (i == 0 || i >= nsub_)
    return false;
  Regexp* re = sub()[i];
  if (re->op_ != kRegexpLiteral &&
      re->op_ != kRegexpLiteralString)
    return false;
  i++;
  if (i < nsub_) {
    for (int j = i; j < nsub_; j++)
      sub()[j]->Incref();
    *suffix = Concat(sub() + i, nsub_ - i, parse_flags());
  } else {
    *suffix = new Regexp(kRegexpEmptyMatch, parse_flags());
  }

  bool latin1 = (re->parse_flags() & Latin1) != 0;
  Rune* runes = re->op_ == kRegexpLiteral ? &re->rune_ : re->runes_;
  int nrunes = re->op_ == kRegexpLiteral ? 1 : re->nrunes_;
  ConvertRunesToBytes(latin1, runes, nrunes, prefix);
  *foldcase = (re->parse_flags() & FoldCase) != 0;
  return true;
}